

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Gia_ManCountFanoutlessFlops(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  Gia_ManCreateRefs(p);
  lVar3 = (long)p->nRegs;
  if (lVar3 < 1) {
    uVar4 = 0;
  }
  else {
    iVar1 = p->vCis->nSize;
    uVar5 = (ulong)(uint)(iVar1 - p->nRegs);
    uVar4 = 0;
    do {
      if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCis->pArray[uVar5];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = (ulong)((int)uVar4 + (uint)(p->pRefs[iVar2] == 0));
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  printf("Fanoutless flops = %d.\n",uVar4);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManCountFanoutlessFlops( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    int Counter = 0;
    Gia_ManCreateRefs( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) == 0 )
            Counter++;
    printf( "Fanoutless flops = %d.\n", Counter );
    ABC_FREE( p->pRefs );
}